

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_tests.cpp
# Opt level: O1

void __thiscall
omp_enumerate_pointer_iterator_types_Test::TestBody(omp_enumerate_pointer_iterator_types_Test *this)

{
  return;
}

Assistant:

TEST(omp_enumerate, pointer_iterator_types) {
  int arr1[] = {1, 2, 3, 4, 5};

  auto e_is_iterator_1 =
      std::is_same_v<int *, typename decltype(omp::enumerate(
                                std::begin(arr1),
                                std::end(arr1)))::iterator::wrapped_iterator>;

  auto e_is_iterator_2 = std::is_same_v<
      int *, typename decltype(omp::enumerate(
                 std::move(std::begin(arr1)),
                 std::move(std::end(arr1))))::iterator::wrapped_iterator>;

  const int arr2[] = {1, 2, 3, 4, 5};

  auto e_is_citerator_1 =
      std::is_same_v<const int *,
                     typename decltype(omp::enumerate(
                         std::begin(arr2),
                         std::end(arr2)))::iterator::wrapped_iterator>;

  auto e_is_citerator_2 = std::is_same_v<
      const int *, typename decltype(omp::enumerate(
                       std::move(std::begin(arr2)),
                       std::move(std::end(arr2))))::iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_iterator_1 && e_is_citerator_1 && e_is_iterator_2 &&
              e_is_citerator_2);

  auto e_is_citerator_3 =
      std::is_same_v<const int *, typename decltype(omp::enumerate(
                                      arr1))::const_iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_citerator_3);
}